

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int arkLSSetMassPreconditioner
              (void *arkode_mem,ARKLsMassPrecSetupFn psetup,ARKLsMassPrecSolveFn psolve)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  ARKodeMem local_30;
  ARKLsMassMem local_28;
  
  iVar1 = arkLs_AccessMassMem(arkode_mem,"arkLSSetMassPreconditioner",&local_30,&local_28);
  if (iVar1 == 0) {
    if (local_28->LS->ops->setpreconditioner ==
        (_func_int_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) {
      msgfmt = "SUNLinearSolver object does not support user-supplied preconditioning";
      iVar1 = -3;
      error_code = -3;
    }
    else {
      local_28->pset = psetup;
      local_28->psolve = psolve;
      if (psetup != (ARKLsMassPrecSetupFn)0x0) {
        psetup = arkLsMPSetup;
      }
      if (psolve != (ARKLsMassPrecSolveFn)0x0) {
        psolve = arkLsMPSolve;
      }
      iVar1 = SUNLinSolSetPreconditioner
                        (local_28->LS,local_30,(SUNPSetupFn)psetup,(SUNPSolveFn)psolve);
      if (iVar1 == 0) {
        return 0;
      }
      msgfmt = "Error in calling SUNLinSolSetPreconditioner";
      iVar1 = -0xc;
      error_code = -0xc;
    }
    arkProcessError(local_30,error_code,"ARKLS","arkLSSetMassPreconditioner",msgfmt);
  }
  return iVar1;
}

Assistant:

int arkLSSetMassPreconditioner(void *arkode_mem,
                               ARKLsMassPrecSetupFn psetup,
                               ARKLsMassPrecSolveFn psolve)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  SUNPSetupFn     arkls_mpsetup;
  SUNPSolveFn     arkls_mpsolve;
  int          retval;

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSSetMassPreconditioner",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* issue error if LS object does not allow user-supplied preconditioning */
  if (arkls_mem->LS->ops->setpreconditioner == NULL) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                    "arkLSSetMassPreconditioner",
                    "SUNLinearSolver object does not support user-supplied preconditioning");
    return(ARKLS_ILL_INPUT);
  }

  /* store function pointers for user-supplied routines in ARKLs interface */
  arkls_mem->pset   = psetup;
  arkls_mem->psolve = psolve;

  /* notify linear solver to call ARKLs interface routines */
  arkls_mpsetup = (psetup == NULL) ? NULL : arkLsMPSetup;
  arkls_mpsolve = (psolve == NULL) ? NULL : arkLsMPSolve;
  retval = SUNLinSolSetPreconditioner(arkls_mem->LS, ark_mem,
                                      arkls_mpsetup, arkls_mpsolve);
  if (retval != SUNLS_SUCCESS) {
    arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, "ARKLS",
                    "arkLSSetMassPreconditioner",
                    "Error in calling SUNLinSolSetPreconditioner");
    return(ARKLS_SUNLS_FAIL);
  }

  return(ARKLS_SUCCESS);
}